

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalysis.cpp
# Opt level: O2

void __thiscall TPZAnalysis::CleanUp(TPZAnalysis *this)

{
  TPZBaseMatrix *pTVar1;
  long lVar2;
  long lVar3;
  
  if (this->fSolver != (TPZSolver *)0x0) {
    (*(this->fSolver->super_TPZSavable)._vptr_TPZSavable[1])();
    this->fSolver = (TPZSolver *)0x0;
  }
  lVar2 = 4;
  for (lVar3 = 0; lVar3 != 0x60; lVar3 = lVar3 + 0x20) {
    if (this->fGraphMesh[lVar2 + -4] != (TPZGraphMesh *)0x0) {
      (*(this->fGraphMesh[lVar2 + -4]->super_TPZSavable)._vptr_TPZSavable[1])();
    }
    this->fGraphMesh[lVar2 + -4] = (TPZGraphMesh *)0x0;
    (**(code **)(*(long *)((long)&this->fScalarNames[0]._vptr_TPZVec + lVar3) + 0x20))();
    (**(code **)(*(long *)((long)&this->fVectorNames[0]._vptr_TPZVec + lVar3) + 0x20))();
    lVar2 = lVar2 + 1;
  }
  this->fGeoMesh = (TPZGeoMesh *)0x0;
  this->fCompMesh = (TPZCompMesh *)0x0;
  pTVar1 = (this->fSolution).fBaseMatrix;
  if (pTVar1 != (TPZBaseMatrix *)0x0) {
    (*(pTVar1->super_TPZSavable)._vptr_TPZSavable[0xe])(pTVar1,0,0);
  }
  TPZAutoPointer<TPZStructMatrix>::operator=(&this->fStructMatrix,(TPZStructMatrix *)0x0);
  TPZAutoPointer<TPZRenumbering>::operator=(&this->fRenumber,(TPZRenumbering *)0x0);
  TPZAutoPointer<TPZGuiInterface>::operator=(&this->fGuiInterface,(TPZGuiInterface *)0x0);
  return;
}

Assistant:

void TPZAnalysis::CleanUp()
{
    if(fSolver) {
        delete fSolver;
        fSolver = nullptr;
    }
    int dim;
    for(dim=0; dim<3; dim++) {
        if(fGraphMesh[dim]) delete fGraphMesh[dim];
        fGraphMesh[dim] = nullptr;
        fScalarNames[dim].resize(0);
        fVectorNames[dim].resize(0);
    }
    fCompMesh = nullptr;
    fGeoMesh = nullptr;
    fSolution.Redim(0,0);
    fStructMatrix = nullptr;
    fRenumber = nullptr;
    fGuiInterface = nullptr;
    
}